

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O3

void __thiscall QProcess::setUnixProcessParameters(QProcess *this,UnixProcessFlags flagsOnly)

{
  QObjectData *pQVar1;
  pointer __old_p;
  _func_int **pp_Var2;
  
  pQVar1 = (this->super_QIODevice).super_QObject.d_ptr.d;
  pp_Var2 = pQVar1[8]._vptr_QObjectData;
  if (pp_Var2 == (_func_int **)0x0) {
    pp_Var2 = (_func_int **)operator_new(0x40);
    *pp_Var2 = (_func_int *)0x0;
    pp_Var2[1] = (_func_int *)0x0;
    pp_Var2[2] = (_func_int *)0x0;
    pp_Var2[3] = (_func_int *)0x0;
    pp_Var2[4] = (_func_int *)0x0;
    pp_Var2[5] = (_func_int *)0x0;
    pp_Var2[6] = (_func_int *)0x0;
    pp_Var2[7] = (_func_int *)0x0;
    pQVar1[8]._vptr_QObjectData = pp_Var2;
  }
  ((QFlagsStorageHelper<QProcess::UnixProcessFlag,_4> *)(pp_Var2 + 4))->
  super_QFlagsStorage<QProcess::UnixProcessFlag> =
       (QFlagsStorage<QProcess::UnixProcessFlag>)
       flagsOnly.super_QFlagsStorageHelper<QProcess::UnixProcessFlag,_4>.
       super_QFlagsStorage<QProcess::UnixProcessFlag>.i;
  *(undefined8 *)((long)pp_Var2 + 0x24) = 0;
  *(undefined8 *)((long)pp_Var2 + 0x2c) = 0;
  pp_Var2[6] = (_func_int *)0x0;
  pp_Var2[7] = (_func_int *)0x0;
  return;
}

Assistant:

void QProcess::setUnixProcessParameters(UnixProcessFlags flagsOnly)
{
    Q_D(QProcess);
    if (!d->unixExtras)
        d->unixExtras.reset(new QProcessPrivate::UnixExtras);
    d->unixExtras->processParameters = { flagsOnly };
}